

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

GLchar * LoadShader(string *file)

{
  long lVar1;
  GLchar *pGVar2;
  runtime_error *this;
  ifstream shaderFile;
  byte abStack_1f8 [488];
  
  std::ifstream::ifstream(&shaderFile);
  std::ifstream::open((string *)&shaderFile,(_Ios_Openmode)file);
  if ((abStack_1f8[*(long *)(_shaderFile + -0x18)] & 5) == 0) {
    std::istream::seekg((long)&shaderFile,_S_beg);
    lVar1 = std::istream::tellg();
    std::istream::seekg((long)&shaderFile,_S_beg);
    pGVar2 = (GLchar *)operator_new__(lVar1 + 1);
    std::istream::read((char *)&shaderFile,(long)pGVar2);
    std::ifstream::close();
    pGVar2[lVar1] = '\0';
    std::ifstream::~ifstream(&shaderFile);
    return pGVar2;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"COULD NOT FIND SHADER FILE");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

GLchar* LoadShader(const std::string &file) {

  std::ifstream shaderFile;
  long shaderFileLength;

  shaderFile.open(file, std::ios::binary);

  if (shaderFile.fail()) {
    throw std::runtime_error("COULD NOT FIND SHADER FILE");
  }

  shaderFile.seekg(0, shaderFile.end);
  shaderFileLength = shaderFile.tellg();
  shaderFile.seekg(0, shaderFile.beg);

  GLchar *shaderCode = new GLchar[shaderFileLength + 1];
  shaderFile.read(shaderCode, shaderFileLength);

  shaderFile.close();

  shaderCode[shaderFileLength] = '\0';

  return shaderCode;
}